

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::OwnFd> __thiscall kj::AsyncCapabilityStream::receiveFd(AsyncCapabilityStream *this)

{
  Promise<kj::Maybe<kj::OwnFd>_> local_20 [2];
  AsyncCapabilityStream *this_local;
  
  this_local = this;
  tryReceiveFd((AsyncCapabilityStream *)local_20);
  Promise<kj::Maybe<kj::OwnFd>>::then<kj::AsyncCapabilityStream::receiveFd()::__0>
            ((Promise<kj::Maybe<kj::OwnFd>> *)this,(Type *)local_20);
  Promise<kj::Maybe<kj::OwnFd>_>::~Promise(local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<OwnFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<OwnFd>&& result) -> Promise<OwnFd> {
    KJ_IF_SOME(r, result) {
      return kj::mv(r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}